

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O2

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
lower_bound<int>(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                 *this,int *key)

{
  int iVar1;
  
  this->num_lookups_ = this->num_lookups_ + 1;
  iVar1 = predict_position(this,key);
  iVar1 = exponential_search_lower_bound<int>(this,iVar1,key);
  return iVar1;
}

Assistant:

int lower_bound(const K& key) {
    num_lookups_++;
    int position = predict_position(key);
    return exponential_search_lower_bound(position, key);
  }